

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanInf.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_63b2::FloatxNanInfTest_DIV_2_47_simple_Test::
FloatxNanInfTest_DIV_2_47_simple_Test(FloatxNanInfTest_DIV_2_47_simple_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00173be0;
  return;
}

Assistant:

TEST(FloatxNanInfTest, DIV_2_47_simple)
{
    using T = flexfloat<2, 47>;
    T a = -(
        7.105427e-15 / 2 -
        1e-17);  // a bit smaller than half of the smallest subnormal in <2,47>
    T b = -(7.105427e-15 / 12.0);
    T c = 0;
    c = a / b;
    EXPECT_EQ(fp_t(a), 0.00000000000000000000);
    EXPECT_EQ(fp_t(b), 0.00000000000000000000);
    EXPECT_NE(c, c);    // holds only for NANs
    EXPECT_NE(c, nan);  // holds only for NANs

    fp_t zero = 0;
    fp_t dynamicnan = zero / zero;

    EXPECT_NE(c, dynamicnan);  // holds only for NANs
}